

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::findOrCreateShape(SemanticParser *this,SP *pbrtShape)

{
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Shape>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
  *this_00;
  element_type *peVar1;
  __shared_ptr<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  iterator iVar3;
  __shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ostream *poVar5;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_ptr<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2> *in;
  SP SVar7;
  __shared_ptr<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2> local_60;
  
  this_00 = (_Rb_tree<std::shared_ptr<pbrt::syntactic::Shape>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
             *)(pbrtShape + 0x11);
  iVar3 = std::
          _Rb_tree<std::shared_ptr<pbrt::syntactic::Shape>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
          ::find(this_00,(key_type *)in_RDX);
  if (iVar3._M_node ==
      (_Base_ptr)
      &pbrtShape[0x11].super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount) {
    std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffc0,in_RDX);
    emitShape(this,pbrtShape);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    p_Var4 = &std::
              map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
              ::operator[]((map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
                            *)this_00,(key_type *)in_RDX)->
              super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>::operator=
              (p_Var4,(__shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *)this);
    peVar1 = (in_RDX->_M_ptr->attributes).
             super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var6._M_pi = extraout_RDX_00;
    if (peVar1 != (element_type *)0x0) {
      *(bool *)((long)&(((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->cameras).
                       super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                       ._M_impl.super__Vector_impl_data + 0x10) = peVar1->reverseOrientation;
      in = &((peVar1->areaLightSources).
             super__Vector_base<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 = *(__shared_ptr<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2> **)
                ((long)&(peVar1->areaLightSources).
                        super__Vector_base<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      if (in != p_Var2) {
        if (0x10 < (ulong)((long)p_Var2 - (long)in)) {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "Warning: Shape has more than one area light!?");
          std::endl<char,std::char_traits<char>>(poVar5);
          in = &((peVar1->areaLightSources).
                 super__Vector_base<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2>;
        }
        std::__shared_ptr<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_60,in);
        parseAreaLight((SemanticParser *)&stack0xffffffffffffffb0,(SP *)in);
        std::__shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2> *)
                   &((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pixelFilter,
                   (__shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2> *)
                   &stack0xffffffffffffffb0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        _Var6._M_pi = extraout_RDX_01;
      }
    }
  }
  else {
    p_Var4 = &std::
              map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
              ::operator[]((map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
                            *)this_00,(key_type *)in_RDX)->
              super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var4);
    _Var6._M_pi = extraout_RDX;
  }
  SVar7.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  SVar7.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar7.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::findOrCreateShape(pbrt::syntactic::Shape::SP pbrtShape)
  {
    if (emittedShapes.find(pbrtShape) != emittedShapes.end())
      return emittedShapes[pbrtShape];

    Shape::SP newShape = emitShape(pbrtShape);
    emittedShapes[pbrtShape] = newShape;

    if (pbrtShape->attributes) {
      newShape->reverseOrientation
        = pbrtShape->attributes->reverseOrientation;
      /* now, add area light sources */
      
      if (!pbrtShape->attributes->areaLightSources.empty()) {
        // std::cout << "Shape has " << pbrtShape->attributes->areaLightSources.size()
        //           << " area light sources..." << std::endl;
        auto &areaLights = pbrtShape->attributes->areaLightSources;
        if (areaLights.size() > 1)
          std::cout << "Warning: Shape has more than one area light!?" << std::endl;
        newShape->areaLight = parseAreaLight(areaLights[0]);
      }
    }

    return newShape;
  }